

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int fftsud(fitsfile *mfptr,HDUtracker *HDU,int newPosition,char *newFileName)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int status;
  int hdunum;
  char filename2 [1025];
  char filename1 [1025];
  int local_850;
  int local_84c;
  char local_848 [1040];
  char local_438 [1032];
  
  local_850 = 0;
  ffghdn(mfptr,&local_84c);
  local_850 = ffflnm(mfptr,local_438,&local_850);
  local_850 = ffrtnm(local_438,local_848,&local_850);
  uVar1 = HDU->nHDU;
  if ((int)uVar1 < 1) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    do {
      if (HDU->position[uVar4] == local_84c) {
        iVar2 = strcmp(HDU->filename[uVar4],local_848);
        if (iVar2 == 0) goto LAB_00175209;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    uVar4 = (ulong)uVar1;
LAB_00175209:
    uVar3 = (uint)uVar4;
  }
  if (uVar3 == uVar1) {
    local_850 = 0x156;
  }
  else {
    if (newPosition != 0) {
      HDU->newPosition[uVar3] = newPosition;
    }
    if (newFileName != (char *)0x0) {
      strcpy(HDU->newFilename[uVar3],newFileName);
    }
  }
  return local_850;
}

Assistant:

int fftsud(fitsfile   *mfptr,       /* pointer to an member HDU             */
	   HDUtracker *HDU,         /* pointer to an HDU tracker struct     */
	   int         newPosition, /* new HDU position of the member HDU   */
	   char       *newFileName) /* file containing member HDU           */

/*
  update the HDU information in the HDUtracker struct pointed to by HDU. The 
  HDU to update is pointed to by mfptr. If non-zero, the value of newPosition
  is used to update the HDU->newPosition[] value for the mfptr, and if
  non-NULL the newFileName value is used to update the HDU->newFilename[]
  value for mfptr.
*/

{
  int i;
  int hdunum;
  int status = 0;

  char filename1[FLEN_FILENAME];
  char filename2[FLEN_FILENAME];


  /* retrieve the HDU's position within the FITS file */
  
  fits_get_hdu_num(mfptr,&hdunum);
  
  /* retrieve the HDU's file name */
  
  status = fits_file_name(mfptr,filename1,&status);
  
  /* parse the file name and construct the "standard" URL for it */
      
  status = ffrtnm(filename1,filename2,&status);

  /* 
     examine all the existing HDUs in the HDUtracker an see if this HDU
     has already been registered
  */

  for(i = 0; i < HDU->nHDU && 
      !(HDU->position[i] == hdunum && strcmp(HDU->filename[i],filename2) == 0);
      ++i);

  /* if previously registered then change newPosition and newFileName */

  if(i != HDU->nHDU) 
    {
      if(newPosition  != 0) HDU->newPosition[i] = newPosition;
      if(newFileName  != NULL) 
	{
	  strcpy(HDU->newFilename[i],newFileName);
	}
    }
  else
    status = MEMBER_NOT_FOUND;
 
  return(status);
}